

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void sdf_tools::die(char *file,int line,char *pattern,...)

{
  char in_AL;
  runtime_error *this;
  undefined8 in_RCX;
  __va_list_tag *args_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string sStack_128;
  string errMsg;
  va_list args;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  args_00 = (__va_list_tag *)(ulong)(uint)line;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  utils::strprintf_abi_cxx11_(&errMsg,"[sdf_tools] %s:%d:\n",file);
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  args[0].reg_save_area = local_c8;
  utils::vstrprintf_abi_cxx11_(&sStack_128,(utils *)pattern,(char *)args,args_00);
  std::__cxx11::string::append((string *)&errMsg);
  std::__cxx11::string::~string((string *)&sStack_128);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&errMsg);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void die(const char *file, int line, const char* pattern, ...)
{
    std::string errMsg = utils::strprintf("[sdf_tools] %s:%d:\n", file, line);

    va_list args;
    va_start(args, pattern);
    errMsg += utils::vstrprintf(pattern, args);
    va_end(args);

    throw std::runtime_error(errMsg);
}